

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O3

double TasGrid::RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)3>
                 (int max_order,int point,double x,bool *isSupported)

{
  double dVar1;
  uint uVar2;
  int result;
  int iVar3;
  uint uVar4;
  double dVar5;
  
  uVar2 = point + 1;
  if (uVar2 < 2) {
    dVar5 = 1.0;
  }
  else {
    iVar3 = 1;
    uVar4 = uVar2;
    do {
      uVar4 = (int)uVar4 >> 1;
      iVar3 = iVar3 * 2;
    } while (1 < uVar4);
    dVar5 = (double)iVar3;
  }
  dVar5 = ((x + 3.0) * dVar5 + -3.0) - (double)(point * 2);
  if ((dVar5 < -1.0) || (1.0 <= dVar5)) {
    *isSupported = dVar5 == 1.0 && x == 1.0;
    if (dVar5 != 1.0 || x != 1.0) {
      return 0.0;
    }
  }
  else {
    *isSupported = true;
  }
  if (point + 1U < 2) {
    dVar1 = 1.0;
  }
  else {
    iVar3 = 1;
    do {
      uVar2 = (int)uVar2 >> 1;
      iVar3 = iVar3 * 2;
    } while (1 < uVar2);
    dVar1 = (double)iVar3;
  }
  if (max_order == 3) {
    if (point != 0) {
      if ((point & 1U) == 0) {
        dVar5 = 0.3333333333333333 - (dVar5 + 2.0) * dVar5;
      }
      else {
        dVar5 = (dVar5 + -2.0) * dVar5 + -0.3333333333333333;
      }
      goto LAB_0019ae16;
    }
  }
  else if (max_order != 2) {
    if (max_order == 1) {
      if (((point == 0) && (x == 1.0)) && (!NAN(x))) {
        return -1.0;
      }
      return (double)(~-(ulong)(0.0 <= dVar5) & (ulong)dVar1 |
                     (ulong)-dVar1 & -(ulong)(0.0 <= dVar5));
    }
    dVar5 = diffPWPower<(TasGrid::RuleLocal::erule)3>(max_order,point,dVar5);
    goto LAB_0019ae16;
  }
  dVar5 = dVar5 * -2.0;
LAB_0019ae16:
  return dVar1 * dVar5;
}

Assistant:

double diffSupport(int max_order, int point, double x, bool &isSupported) {
        switch(effrule) {
            case erule::pwc:
                isSupported = false;
                return 0.0;
            case erule::localp: {
                if (point == 0) { isSupported = true; return 0.0; }
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 2) ? an : (((xn >= 0 ? -1.0 : 1.0) * an));
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            case erule::semilocalp:
                switch(point) {
                    case 0: { isSupported = true; return 0.0; }
                    case 1: { isSupported = true; return x - 0.5; }
                    case 2: { isSupported = true; return x + 0.5; }
                    default: {
                        double xn = scaleX<effrule>(point, x);
                        isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                        if (isSupported) {
                            double an = scaleDiffX<effrule>(point);
                            switch(max_order) {
                                case 2: return an * diffPWQuadratic<effrule>(point, xn);
                                case 3: return an * diffPWCubic<effrule>(point, xn);
                                default:
                                    return an * diffPWPower<effrule>(max_order, point, xn);
                            };
                        } else {
                            return 0.0;
                        }
                    }
                };
            case erule::localp0: {
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return (x == 1.0 and point == 0) ? -1.0 : ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
            default: { // case erule::localpb:
                double xn = scaleX<effrule>(point, x);
                isSupported = (-1.0 <= xn and xn < 1.0) or (x == 1.0 and xn == 1.0);
                if (isSupported) {
                    double an = scaleDiffX<effrule>(point);
                    switch(max_order) {
                        case 1: return ((xn >= 0 ? -1.0 : 1.0) * an);
                        case 2: return an * diffPWQuadratic<effrule>(point, xn);
                        case 3: return an * diffPWCubic<effrule>(point, xn);
                        default:
                            return an * diffPWPower<effrule>(max_order, point, xn);
                    };
                } else {
                    return 0.0;
                }
            }
        };
    }